

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stable-imu-fixed-contact-dynamical-system.cpp
# Opt level: O1

void __thiscall
stateObservation::flexibilityEstimation::StableIMUFixedContactDynamicalSystem::
StableIMUFixedContactDynamicalSystem(StableIMUFixedContactDynamicalSystem *this,double dt)

{
  DynamicalSystemFunctorBase::DynamicalSystemFunctorBase(&this->super_DynamicalSystemFunctorBase);
  (this->super_DynamicalSystemFunctorBase)._vptr_DynamicalSystemFunctorBase =
       (_func_int **)&PTR__StableIMUFixedContactDynamicalSystem_001b6628;
  AccelerometerGyrometer::AccelerometerGyrometer(&this->sensor_,false,false,false);
  this->processNoise_ = (NoiseBase *)0x0;
  this->dt_ = dt;
  (this->orientationVector_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_2,_3,_1>_>.m_storage.
  m_data.array[0] = 0.0;
  (this->orientationVector_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_2,_3,_1>_>.m_storage.
  m_data.array[1] = 0.0;
  (this->orientationVector_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_2,_3,_1>_>.m_storage.
  m_data.array[2] = 0.0;
  (this->quaternion_).m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_2,_4,_1>_>.
  m_storage.m_data.array[0] = 0.0;
  (this->quaternion_).m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_2,_4,_1>_>.
  m_storage.m_data.array[1] = 0.0;
  *(undefined4 *)
   ((this->quaternion_).m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_2,_4,_1>_>.
    m_storage.m_data.array + 2) = 0;
  *(undefined4 *)
   ((long)(this->quaternion_).m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_2,_4,_1>_>.
          m_storage.m_data.array + 0x14) = 0;
  *(undefined4 *)
   ((this->quaternion_).m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_2,_4,_1>_>.
    m_storage.m_data.array + 3) = 0;
  *(undefined4 *)
   ((long)(this->quaternion_).m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_2,_4,_1>_>.
          m_storage.m_data.array + 0x1c) = 0x3ff00000;
  this->measurementSize_ = 6;
  (this->contactPositions_).
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->contactPositions_).
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->contactPositions_).
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

StableIMUFixedContactDynamicalSystem::StableIMUFixedContactDynamicalSystem(double dt)
: processNoise_(0x0), dt_(dt), orientationVector_(Vector3::Zero()), quaternion_(Quaternion::Identity()),
  measurementSize_(measurementSizeBase_){
#ifdef STATEOBSERVATION_VERBOUS_CONSTRUCTORS
//        std::cout<<std::endl<<"IMUFixedContactDynamicalSystem Constructor"<<std::endl;
#endif // STATEOBSERVATION_VERBOUS_CONSTRUCTOR
  }